

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.h
# Opt level: O2

void idx2::WriteStream(bitstream *Bs,bitstream *Src)

{
  uint uVar1;
  u64 *puVar2;
  ulong *puVar3;
  ulong uVar4;
  buffer local_50;
  buffer Dst;
  
  puVar2 = (u64 *)Bs->BitPtr;
  *puVar2 = Bs->BitBuf;
  Bs->BitPtr = (byte *)((long)(int)(((Bs->BitPos >> 3) + 1) - (uint)((Bs->BitPos & 7U) == 0)) +
                       (long)puVar2);
  Bs->BitPos = 0;
  Bs->BitBuf = 0;
  puVar3 = (ulong *)Src->BitPtr;
  uVar4 = Src->BitBuf;
  *puVar3 = uVar4;
  uVar1 = Src->BitPos;
  if (0 < (int)uVar1 >> 3) {
    Src->BitBuf = (uVar4 >> 1) >> (((byte)uVar1 & 0xf8) - 1 & 0x3f);
  }
  Src->BitPtr = (byte *)((long)puVar3 + (long)((int)uVar1 >> 3));
  Src->BitPos = uVar1 & 7;
  operator+(&Dst,&Bs->Stream,
            (i64)(Bs->BitPtr + ((long)((Bs->BitPos + 7) / 8) - (long)(Bs->Stream).Data)));
  local_50.Data = (Src->Stream).Data;
  local_50.Alloc = (Src->Stream).Alloc;
  local_50.Bytes = (i64)(Src->BitPtr + ((long)((Src->BitPos + 7) / 8) - (long)local_50.Data));
  MemCopy(&local_50,&Dst);
  Bs->BitPtr = Bs->BitPtr +
               (long)(Src->BitPtr + ((long)((Src->BitPos + 7) / 8) - (long)(Src->Stream).Data));
  return;
}

Assistant:

inline void
WriteStream(bitstream* Bs, bitstream* Src)
{
  FlushAndMoveToNextByte(Bs);
  Flush(Src);
  buffer Dst = Bs->Stream + Size(*Bs);
  MemCopy(ToBuffer(*Src), &Dst);
  Bs->BitPtr += Size(*Src);
}